

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O2

int CVmObjList::getp_map(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *argc)

{
  vm_val_t *funcptr;
  CVmObjPageEntry *pCVar1;
  ushort *lst_00;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  vm_val_t *pvVar4;
  int iVar5;
  vm_obj_id_t vVar6;
  ulong uVar7;
  size_t idx;
  bool bVar8;
  vm_rcdesc rc;
  
  if ((getp_map(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar5 = __cxa_guard_acquire(&getp_map(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::
                                   desc), iVar5 != 0)) {
    getp_map::desc.min_argc_ = 1;
    getp_map::desc.opt_argc_ = 0;
    getp_map::desc.varargs_ = 0;
    __cxa_guard_release(&getp_map(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar5 = CVmObject::get_prop_check_argc(retval,argc,&getp_map::desc);
  if (iVar5 == 0) {
    vm_rcdesc::init(&rc,(EVP_PKEY_CTX *)"List.mapAll");
    pvVar4 = sp_;
    funcptr = sp_ + -1;
    uVar3 = *(undefined4 *)&self_val->field_0x4;
    aVar2 = self_val->val;
    sp_ = sp_ + 1;
    pvVar4->typ = self_val->typ;
    *(undefined4 *)&pvVar4->field_0x4 = uVar3;
    pvVar4->val = aVar2;
    vVar6 = create(0,lst);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar6;
    pvVar4 = sp_;
    pCVar1 = G_obj_table_X.pages_[vVar6 >> 0xc];
    lst_00 = *(ushort **)((long)&pCVar1[vVar6 & 0xfff].ptr_ + 8);
    uVar7 = (ulong)*lst_00;
    uVar3 = *(undefined4 *)&retval->field_0x4;
    aVar2 = retval->val;
    sp_ = sp_ + 1;
    pvVar4->typ = retval->typ;
    *(undefined4 *)&pvVar4->field_0x4 = uVar3;
    pvVar4->val = aVar2;
    idx = 0;
    while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
      index_and_push((char *)lst_00,(uint)(idx + 1));
      CVmRun::call_func_ptr(&G_interpreter_X,funcptr,1,&rc,0);
      cons_set_element((CVmObjList *)(pCVar1 + (vVar6 & 0xfff)),idx,&r0_);
      idx = idx + 1;
    }
    sp_ = sp_ + -3;
  }
  return 1;
}

Assistant:

int CVmObjList::getp_map(VMG_ vm_val_t *retval, const vm_val_t *self_val,
                         const char *lst, uint *argc)
{
    uint orig_argc = (argc != 0 ? *argc : 0);
    const vm_val_t *func_val;
    size_t cnt;
    size_t idx;
    char *new_lst;
    CVmObjList *new_lst_obj;
    static CVmNativeCodeDesc desc(1);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* set up the recursive caller context */
    vm_rcdesc rc(vmg_ "List.mapAll", self_val, 2, G_stk->get(0), orig_argc);

    /* get the function pointer argument, but leave it on the stack */
    func_val = G_stk->get(0);

    /* push a self-reference while allocating to protect from gc */
    G_stk->push(self_val);

    /* 
     *   Make a copy of our list for the return value, since the result
     *   value is always the same size as our current list.  By making a
     *   copy of the input list, we also can avoid worrying about whether
     *   the input list was a constant, and hence we don't have to worry
     *   about the possibility of constant page swapping - we'll just
     *   update elements of the copy in-place.  
     */
    retval->set_obj(create(vmg_ FALSE, lst));

    /* get the return value list data */
    new_lst_obj = (CVmObjList *)vm_objp(vmg_ retval->val.obj);
    new_lst = new_lst_obj->ext_;

    /* get the length of the list */
    cnt = vmb_get_len(new_lst);

    /* 
     *   push a reference to the new list to protect it from the garbage
     *   collector, which could be invoked in the course of executing the
     *   user callback 
     */
    G_stk->push(retval);

    /*
     *   Go through each element of our list, and invoke the callback on
     *   each element.  Replace each element with the result of the
     *   callback.  
     */
    for (idx = 0 ; idx < cnt ; ++idx)
    {
        /* 
         *   get this element (using a 1-based index), and push it as the
         *   callback's argument 
         */
        index_and_push(vmg_ new_lst, idx + 1);
        
        /* invoke the callback */
        G_interpreter->call_func_ptr(vmg_ func_val, 1, &rc, 0);

        /* store the result in the list */
        new_lst_obj->cons_set_element(idx, G_interpreter->get_r0());
    }

    /* discard our gc protection (self, return value) and our arguments */
    G_stk->discard(3);

    /* handled */
    return TRUE;
}